

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

Vec_Int_t * Gia_ManSimDeriveResets(Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  int iVar6;
  void *__s;
  Vec_Int_t *pVVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  Gia_Obj_t *pGVar20;
  ulong uVar21;
  uint uVar22;
  timespec ts;
  timespec local_40;
  
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar6 = pGia->nObjs;
  uVar9 = (long)iVar6 * 2;
  uVar15 = (uint)uVar9;
  uVar10 = 0x10;
  if (0xe < uVar15 - 1) {
    uVar10 = uVar15;
  }
  if ((uVar10 == 0) || (__s = malloc((long)(int)uVar10 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0,(long)iVar6 << 3);
  }
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar7->pArray = piVar8;
  iVar18 = pGia->nRegs;
  if (0 < iVar18) {
    iVar14 = 0;
    do {
      iVar3 = pGia->vCos->nSize;
      uVar10 = (iVar3 - iVar18) + iVar14;
      if (((int)uVar10 < 0) || (iVar3 <= (int)uVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar10 = pGia->vCos->pArray[uVar10];
      if (((long)(int)uVar10 < 0) || (pGia->nObjs <= (int)uVar10)) goto LAB_00224423;
      pGVar4 = pGia->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar4 + (int)uVar10;
      uVar19 = (uint)*(ulong *)pGVar1;
      if (uVar10 != (uVar19 & 0x1fffffff)) {
        pGVar20 = (Gia_Obj_t *)
                  ((ulong)(pGVar1 + -(ulong)(uVar19 & 0x1fffffff)) & 0xfffffffffffffffe);
        if ((pGVar20 < pGVar4) || (pGVar4 + (uint)pGia->nObjs <= pGVar20)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar18 = (int)((ulong)((long)pGVar20 - (long)pGVar4) >> 2);
        if (iVar18 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar10 = (((uint)(*(ulong *)pGVar1 >> 0x1d) ^ (uint)(pGVar1 + -(ulong)(uVar19 & 0x1fffffff))
                  ) & 1) + iVar18 * 0x55555556;
        if ((int)uVar15 <= (int)uVar10) {
LAB_00224404:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar8 = (int *)((long)__s + (ulong)uVar10 * 4);
        *piVar8 = *piVar8 + 1;
        Gia_ManSimCollect(pGia,pGVar1 + -(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff),pVVar7);
        iVar18 = pVVar7->nSize;
        if (0 < (long)iVar18) {
          piVar8 = pVVar7->pArray;
          lVar12 = 0;
          do {
            uVar10 = piVar8[lVar12];
            if (((long)(int)uVar10 < 0) || (uVar15 <= uVar10)) goto LAB_00224404;
            piVar2 = (int *)((long)__s + (long)(int)uVar10 * 4);
            *piVar2 = *piVar2 + 1;
            lVar12 = lVar12 + 1;
          } while (iVar18 != lVar12);
        }
      }
      iVar14 = iVar14 + 1;
      iVar18 = pGia->nRegs;
    } while (iVar14 < iVar18);
    piVar8 = pVVar7->pArray;
  }
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  free(pVVar7);
  iVar18 = pGia->nObjs;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar18 - 1U) {
    iVar14 = iVar18;
  }
  pVVar7->nCap = iVar14;
  if (iVar14 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = iVar18;
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar14 << 2);
    pVVar7->pArray = piVar8;
    pVVar7->nSize = iVar18;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)0x0;
    }
    else {
      memset(piVar8,0xff,(long)iVar18 << 2);
    }
  }
  if (iVar6 < 1) {
    uVar21 = 0;
    uVar19 = 0;
    uVar22 = 0;
    uVar10 = 0;
    uVar15 = 0;
    uVar13 = 0;
    uVar9 = 0;
    uVar16 = 0;
    if (__s == (void *)0x0) goto LAB_00224360;
  }
  else {
    uVar13 = 0;
    uVar19 = 0;
    uVar22 = 0;
    uVar10 = 0;
    uVar15 = 0;
    do {
      if (4 < *(int *)((long)__s + uVar13 * 4)) {
        uVar16 = uVar13 >> 1 & 0x7fffffff;
        iVar6 = (int)uVar16;
        if (pGia->nObjs <= iVar6) {
LAB_00224423:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar4 = pGia->pObjs;
        if ((uVar13 & 1) == 0) {
          if (iVar18 <= iVar6) {
LAB_00224461:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar8[uVar16] = 1;
          uVar5 = *(undefined8 *)(pGVar4 + uVar16);
          uVar17 = 0;
          if (((uint)uVar5 & 0x9fffffff) == 0x9fffffff) {
            uVar17 = (uint)((int)((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff) <
                           pGia->vCis->nSize - pGia->nRegs);
          }
          uVar19 = uVar19 + uVar17;
          uVar10 = uVar10 + 1;
        }
        else {
          if (iVar18 <= iVar6) goto LAB_00224461;
          piVar8[uVar16] = 0;
          uVar5 = *(undefined8 *)(pGVar4 + uVar16);
          uVar17 = 0;
          if (((uint)uVar5 & 0x9fffffff) == 0x9fffffff) {
            uVar17 = (uint)((int)((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff) <
                           pGia->vCis->nSize - pGia->nRegs);
          }
          uVar22 = uVar22 + uVar17;
          uVar15 = uVar15 + 1;
        }
      }
      uVar13 = uVar13 + 1;
    } while ((uVar9 & 0xffffffff) != uVar13);
  }
  uVar21 = (ulong)uVar19;
  free(__s);
  uVar13 = (ulong)uVar22;
  uVar9 = (ulong)uVar10;
  uVar16 = (ulong)uVar15;
LAB_00224360:
  printf("Logic0 = %d (%d). Logic1 = %d (%d). ",uVar16,uVar13,uVar9,uVar21);
  iVar18 = 3;
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar18,"%s =","Time");
  Abc_Print(iVar18,"%9.2f sec\n",(double)(lVar12 + lVar11) / 1000000.0);
  return pVVar7;
}

Assistant:

Vec_Int_t * Gia_ManSimDeriveResets( Gia_Man_t * pGia )
{
    int nImpLimit = 5;
    Vec_Int_t * vResult;
    Vec_Int_t * vCountLits, * vSuperGate;
    Gia_Obj_t * pObj;
    int i, k, Lit, Count;
    int Counter0 = 0, Counter1 = 0;
    int CounterPi0 = 0, CounterPi1 = 0;
    abctime clk = Abc_Clock();

    // create reset counters for each literal
    vCountLits = Vec_IntStart( 2 * Gia_ManObjNum(pGia) );

    // collect implications for each flop input driver
    vSuperGate = Vec_IntAlloc( 1000 );
    Gia_ManForEachRi( pGia, pObj, i )
    {
        if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
            continue;
        Vec_IntAddToEntry( vCountLits, Gia_ObjToLit(pGia, Gia_ObjChild0(pObj)), 1 );
        Gia_ManSimCollect( pGia, Gia_ObjFanin0(pObj), vSuperGate );
        Vec_IntForEachEntry( vSuperGate, Lit, k )
            Vec_IntAddToEntry( vCountLits, Lit, 1 );
    }
    Vec_IntFree( vSuperGate );

    // label signals whose counter if more than the limit
    vResult = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    Vec_IntForEachEntry( vCountLits, Count, Lit )
    {
        if ( Count < nImpLimit )
            continue;
        pObj = Gia_ManObj( pGia, Abc_Lit2Var(Lit) );
        if ( Abc_LitIsCompl(Lit) ) // const 0
        {
//            Ssm_ObjSetLogic0( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 0 );
            CounterPi0 += Gia_ObjIsPi(pGia, pObj);
            Counter0++;
        }
        else
        {
//            Ssm_ObjSetLogic1( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 1 );
            CounterPi1 += Gia_ObjIsPi(pGia, pObj);
            Counter1++;
        }
//        if ( Gia_ObjIsPi(pGia, pObj) )
//            printf( "%d ", Count );
    }
//    printf( "\n" );
    Vec_IntFree( vCountLits );

    printf( "Logic0 = %d (%d). Logic1 = %d (%d). ", Counter0, CounterPi0, Counter1, CounterPi1 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vResult;
}